

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O2

Gia_Man_t * Gia_ManDupPerm(Gia_Man_t *p,Vec_Int_t *vPiPerm)

{
  uint uVar1;
  int iVar2;
  int iLit1;
  Gia_Man_t *p_00;
  char *pcVar3;
  Gia_Obj_t *pGVar4;
  ulong uVar5;
  int iVar6;
  
  if (vPiPerm->nSize != p->vCis->nSize - p->nRegs) {
    __assert_fail("Vec_IntSize(vPiPerm) == Gia_ManPiNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaDup.c"
                  ,0x33f,"Gia_Man_t *Gia_ManDupPerm(Gia_Man_t *, Vec_Int_t *)");
  }
  p_00 = Gia_ManStart(p->nObjs);
  pcVar3 = Abc_UtilStrsav(p->pName);
  p_00->pName = pcVar3;
  pcVar3 = Abc_UtilStrsav(p->pSpec);
  p_00->pSpec = pcVar3;
  p->pObjs->Value = 0;
  for (iVar6 = 0; iVar6 < p->vCis->nSize - p->nRegs; iVar6 = iVar6 + 1) {
    pGVar4 = Gia_ManCi(p,iVar6);
    if (pGVar4 == (Gia_Obj_t *)0x0) break;
    uVar1 = Gia_ManAppendCi(p_00);
    iVar2 = Vec_IntEntry(vPiPerm,iVar6);
    pGVar4 = Gia_ManPi(p,iVar2);
    pGVar4->Value = uVar1;
  }
  for (iVar6 = 1; iVar6 < p->nObjs; iVar6 = iVar6 + 1) {
    pGVar4 = Gia_ManObj(p,iVar6);
    if (pGVar4 == (Gia_Obj_t *)0x0) break;
    uVar1 = (uint)*(ulong *)pGVar4;
    uVar5 = *(ulong *)pGVar4 & 0x1fffffff;
    if (uVar5 == 0x1fffffff || (int)uVar1 < 0) {
      if ((~uVar1 & 0x9fffffff) == 0) {
        iVar2 = Gia_ObjIsRo(p,pGVar4);
        if (iVar2 != 0) {
          uVar1 = Gia_ManAppendCi(p_00);
          goto LAB_001d55d6;
        }
      }
      else if ((int)uVar1 < 0 && (int)uVar5 != 0x1fffffff) {
        iVar2 = Gia_ObjFanin0Copy(pGVar4);
        uVar1 = Gia_ManAppendCo(p_00,iVar2);
        goto LAB_001d55d6;
      }
    }
    else {
      iVar2 = Gia_ObjFanin0Copy(pGVar4);
      iLit1 = Gia_ObjFanin1Copy(pGVar4);
      uVar1 = Gia_ManAppendAnd(p_00,iVar2,iLit1);
LAB_001d55d6:
      pGVar4->Value = uVar1;
    }
  }
  Gia_ManSetRegNum(p_00,p->nRegs);
  return p_00;
}

Assistant:

Gia_Man_t * Gia_ManDupPerm( Gia_Man_t * p, Vec_Int_t * vPiPerm )
{
//    Vec_Int_t * vPiPermInv;
    Gia_Man_t * pNew;
    Gia_Obj_t * pObj;
    int i;
    assert( Vec_IntSize(vPiPerm) == Gia_ManPiNum(p) );
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManConst0(p)->Value = 0;
//    vPiPermInv = Vec_IntInvert( vPiPerm, -1 );
    Gia_ManForEachPi( p, pObj, i )
//        Gia_ManPi(p, Vec_IntEntry(vPiPermInv,i))->Value = Gia_ManAppendCi( pNew );
        Gia_ManPi(p, Vec_IntEntry(vPiPerm,i))->Value = Gia_ManAppendCi( pNew );
//    Vec_IntFree( vPiPermInv );
    Gia_ManForEachObj1( p, pObj, i )
    {
        if ( Gia_ObjIsAnd(pObj) )
            pObj->Value = Gia_ManAppendAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
        else if ( Gia_ObjIsCi(pObj) )
        {
            if ( Gia_ObjIsRo(p, pObj) )
                pObj->Value = Gia_ManAppendCi( pNew );
        }
        else if ( Gia_ObjIsCo(pObj) )
            pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    }
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) );
    return pNew;
}